

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary_gnu(FILE *fp,void **argtable)

{
  arg_dstr_t ds;
  
  ds = arg_dstr_create();
  arg_print_glossary_gnu_ds(ds,argtable);
  fputs(ds->data,(FILE *)fp);
  arg_dstr_destroy(ds);
  return;
}

Assistant:

void arg_print_glossary_gnu(FILE* fp, void** argtable) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_glossary_gnu_ds(ds, argtable);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}